

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testserverconnector.hpp
# Opt level: O2

json __thiscall TestServerConnector::VerifyBatchResponse_abi_cxx11_(TestServerConnector *this)

{
  code *pcVar1;
  double dVar2;
  char extraout_AL;
  json_value extraout_RDX;
  long in_RSI;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  json jVar3;
  ExpressionDecomposer local_f4;
  Result local_f0;
  ulong local_d0;
  _Any_data local_c8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  ResultBuilder DOCTEST_RB;
  
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8._M_unused._M_object = (void *)0x0;
  local_c8._8_8_ = 0;
  nlohmann::
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
  ::parse<std::__cxx11::string&>
            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>
              *)this,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (in_RSI + 8),(parser_callback_t *)&local_c8,true,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_c8);
  doctest::String::String((String *)&local_f0,"");
  doctest::detail::ResultBuilder::ResultBuilder
            (&DOCTEST_RB,DT_REQUIRE,
             "/workspace/llm4binary/github/license_c_cmakelists/jsonrpcx[P]json-rpc-cxx/test/testserverconnector.hpp"
             ,0x22,"result.is_array()","",(String *)&local_f0);
  doctest::String::~String((String *)&local_f0);
  doctest::detail::ExpressionDecomposer::ExpressionDecomposer(&local_f4,DT_REQUIRE);
  local_d0 = (ulong)(*(char *)&this->handler == '\x02') | (ulong)local_f4.m_at << 0x20;
  doctest::detail::Expression_lhs::operator_cast_to_Result(&local_f0,(Expression_lhs *)&local_d0);
  doctest::detail::ResultBuilder::setResult(&DOCTEST_RB,&local_f0);
  doctest::String::~String(&local_f0.m_decomp);
  dVar2 = doctest::detail::ResultBuilder::log
                    (&DOCTEST_RB,(double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da));
  if (extraout_AL != '\0') {
    pcVar1 = (code *)swi(3);
    jVar3 = (json)(*pcVar1)(SUB84(dVar2,0));
    return jVar3;
  }
  doctest::detail::ResultBuilder::react(&DOCTEST_RB);
  doctest::AssertData::~AssertData(&DOCTEST_RB.super_AssertData);
  jVar3.m_value.object = extraout_RDX.object;
  jVar3._0_8_ = this;
  return jVar3;
}

Assistant:

json VerifyBatchResponse() {
        json result = json::parse(raw_response);
        REQUIRE(result.is_array());
        return result;
    }